

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void __thiscall QItemSelectionRangeRefCache::populate(QItemSelectionRangeRefCache *this)

{
  int iVar1;
  
  if (this->m_top < -1) {
    iVar1 = QPersistentModelIndex::row(&this->m_range->tl);
    this->m_top = iVar1;
    iVar1 = QPersistentModelIndex::column(&this->m_range->tl);
    this->m_left = iVar1;
    iVar1 = QPersistentModelIndex::row(&this->m_range->br);
    this->m_bottom = iVar1;
    iVar1 = QPersistentModelIndex::column(&this->m_range->br);
    this->m_right = iVar1;
  }
  return;
}

Assistant:

inline void populate()
    {
        if (m_top > -2)
            return;
        m_top = m_range.top();
        m_left = m_range.left();
        m_bottom = m_range.bottom();
        m_right = m_range.right();
    }